

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O0

void __thiscall dynet::Trainer::update(Trainer *this,real scale)

{
  bool bVar1;
  reference puVar2;
  reference puVar3;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_RDI;
  undefined4 in_XMM0_Da;
  uint j;
  iterator __end3;
  iterator __begin3;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range3;
  uint i_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *upd_lookup_params;
  vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
  *lookup_params;
  uint i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *upd_params;
  vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_> *params;
  float gscale;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  _Node_iterator_base<unsigned_int,_false> in_stack_ffffffffffffff78;
  _Node_iterator_base<unsigned_int,_false> in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar4;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_50;
  vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
  *local_48;
  uint local_3c;
  uint *local_38;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_20;
  vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_> *local_18;
  float local_10;
  undefined4 local_c;
  
  local_c = in_XMM0_Da;
  if (((ulong)(in_RDI->_M_h)._M_single_bucket & 0x100) == 0) {
    (**(code **)((((_Vector_impl *)&(in_RDI->_M_h)._M_buckets)->super__Vector_impl_data)._M_start +
                4))();
    *(undefined1 *)((long)&(in_RDI->_M_h)._M_single_bucket + 1) = 1;
  }
  local_10 = clip_gradients((Trainer *)in_stack_ffffffffffffff80._M_cur,
                            (real)((ulong)in_stack_ffffffffffffff78._M_cur >> 0x20));
  local_18 = Model::parameters_list(*(Model **)(in_RDI + 1));
  local_28 = Model::updated_parameters_list(*(Model **)(in_RDI + 1));
  local_20 = local_28;
  local_30._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI);
  local_38 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             *)in_RDI), bVar1) {
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_30);
    local_3c = *puVar2;
    (**(code **)((((_Vector_impl *)&(in_RDI->_M_h)._M_buckets)->super__Vector_impl_data)._M_start +
                8))(local_c,local_10,in_RDI,local_3c);
    std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>::operator[]
              (local_18,(ulong)local_3c);
    ParameterStorage::clear
              ((ParameterStorage *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&local_30);
  }
  local_48 = Model::lookup_parameters_list(*(Model **)(in_RDI + 1));
  local_58 = Model::updated_lookup_parameters_list(*(Model **)(in_RDI + 1));
  local_50 = local_58;
  local_60._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             *)in_RDI), bVar1) {
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_60);
    uVar4 = *puVar2;
    if (((ulong)(in_RDI->_M_h)._M_single_bucket & 1) == 0) {
      (**(code **)((((_Vector_impl *)&(in_RDI->_M_h)._M_buckets)->super__Vector_impl_data)._M_start
                  + 0xc))(local_c,local_10,in_RDI,uVar4);
    }
    else {
      std::vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
      ::operator[](local_48,(ulong)uVar4);
      in_stack_ffffffffffffff80._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin(in_RDI);
      in_stack_ffffffffffffff78._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::end(in_RDI);
      while (bVar1 = std::__detail::operator!=
                               ((_Node_iterator_base<unsigned_int,_false> *)&stack0xffffffffffffff80
                                ,(_Node_iterator_base<unsigned_int,_false> *)
                                 &stack0xffffffffffffff78), bVar1) {
        puVar3 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*
                           ((_Node_iterator<unsigned_int,_true,_false> *)0xc7eeaa);
        in_stack_ffffffffffffff74 = *puVar3;
        (**(code **)((((_Vector_impl *)&(in_RDI->_M_h)._M_buckets)->super__Vector_impl_data).
                     _M_start + 10))(local_c,local_10,in_RDI,uVar4,in_stack_ffffffffffffff74);
        std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++
                  ((_Node_iterator<unsigned_int,_true,_false> *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      }
    }
    std::vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>::
    operator[](local_48,(ulong)uVar4);
    LookupParameterStorage::clear
              ((LookupParameterStorage *)CONCAT44(uVar4,in_stack_ffffffffffffff90));
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&local_60);
  }
  *(float *)&(in_RDI->_M_h)._M_rehash_policy.field_0x4 =
       *(float *)&(in_RDI->_M_h)._M_rehash_policy.field_0x4 + 1.0;
  *(float *)((long)&(in_RDI->_M_h)._M_rehash_policy._M_next_resize + 4) =
       *(float *)((long)&(in_RDI->_M_h)._M_rehash_policy._M_next_resize + 4) + 1.0;
  L2WeightDecay::update_weight_decay
            ((L2WeightDecay *)in_stack_ffffffffffffff80._M_cur,
             (uint)((ulong)in_stack_ffffffffffffff78._M_cur >> 0x20));
  bVar1 = L2WeightDecay::parameters_need_rescaled(*(L2WeightDecay **)(in_RDI + 1));
  if (bVar1) {
    rescale_and_reset_weight_decay
              ((Trainer *)__end3.super__Node_iterator_base<unsigned_int,_false>._M_cur);
  }
  return;
}

Assistant:

void Trainer::update(real scale) {
  // Allocate if necessary
  if(!aux_allocated) {
    alloc_impl();
    aux_allocated = true;
  }

  // Perform gradient clipping and cycle through parameters
  const float gscale = clip_gradients(scale);
  const auto & params = model->parameters_list();
  const auto & upd_params = model->updated_parameters_list();
  for(auto i : upd_params) {
    update_params(scale, gscale, i);
    params[i]->clear();
  }
  const auto & lookup_params = model->lookup_parameters_list();
  const auto & upd_lookup_params = model->updated_lookup_parameters_list();
  for(auto i : upd_lookup_params) {
    if(sparse_updates_enabled) {
      for (auto j : lookup_params[i]->non_zero_grads)
        update_lookup_params(scale, gscale, i, j);
    } else {
      update_lookup_params(scale, gscale, i);
    }
    lookup_params[i]->clear();
  }
  ++updates;
  ++updates_since_status;

  model->weight_decay.update_weight_decay(); // update global weight scale
  if (model->weight_decay.parameters_need_rescaled())
    rescale_and_reset_weight_decay();  // if wdscale is getting to small multiply all weights by wdscale, and set wdscale to 1
}